

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelContainedInSpatialStructure::~IfcRelContainedInSpatialStructure
          (IfcRelContainedInSpatialStructure *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  void *pvVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcRelContainedInSpatialStructure_0081d110;
  *(undefined ***)&this->field_0xd8 = &PTR__IfcRelContainedInSpatialStructure_0081d1b0;
  *(undefined ***)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x88 =
       &PTR__IfcRelContainedInSpatialStructure_0081d138;
  *(undefined ***)&(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.field_0x98 =
       &PTR__IfcRelContainedInSpatialStructure_0081d160;
  *(undefined ***)&(this->super_IfcRelConnects).super_IfcRelationship.field_0xa8 =
       &PTR__IfcRelContainedInSpatialStructure_0081d188;
  pvVar2 = *(void **)&(this->super_IfcRelConnects).field_0xb8;
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,*(long *)&this->field_0xc8 - (long)pvVar2);
  }
  (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x81d3a0;
  *(undefined8 *)&this->field_0xd8 = 0x81d3c8;
  pcVar3 = (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.Description.ptr.
           _M_dataplus._M_p;
  paVar1 = &(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.Description.ptr.field_2
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.Name.ptr._M_dataplus.
           _M_p;
  paVar1 = &(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.Name.ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  puVar4 = *(undefined1 **)
            &(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x10;
  puVar5 = &(this->super_IfcRelConnects).super_IfcRelationship.super_IfcRoot.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x20;
  if (puVar4 != puVar5) {
    operator_delete(puVar4,*(long *)puVar5 + 1);
    return;
  }
  return;
}

Assistant:

IfcRelContainedInSpatialStructure() : Object("IfcRelContainedInSpatialStructure") {}